

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void r4k_fill_tlb(CPUMIPSState_conflict5 *env,int idx)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  CPUMIPSTLBContext_conflict1 *pCVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ulong *puVar11;
  ushort uVar12;
  ulong uVar13;
  ushort uVar14;
  ulong uVar15;
  
  pCVar4 = env->tlb;
  puVar11 = (ulong *)((long)&pCVar4->mmu + (long)idx * 0x28);
  if ((env->CP0_EntryHi & 0x400) == 0) {
    iVar3 = env->CP0_PageMask;
    uVar2 = *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14);
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) = uVar2 & 0x7fff;
    uVar13 = env->CP0_EntryHi;
    uVar15 = uVar13 & 0xffffffffffffe000;
    *puVar11 = uVar15;
    *puVar11 = uVar15 & env->SEGMask;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0xc) =
         (ushort)uVar13 & (ushort)(int)env->CP0_EntryHi_ASID_mask;
    *(int32_t *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x10) = env->CP0_MemoryMapID;
    *(int32_t *)((long)&pCVar4->mmu + (long)idx * 0x28 + 8) = env->CP0_PageMask;
    uVar12 = (ushort)(int)env->CP0_EntryLo1 & (ushort)(int)env->CP0_EntryLo0 & 1;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) = uVar2 & 0x7ffe | uVar12;
    uVar7 = (ushort)(((uint)env->CP0_EntryLo0 & 2) << 6);
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) = uVar2 & 0x7f7e | uVar12 | uVar7;
    uVar8 = (ushort)(((uint)env->CP0_EntryLo0 & 4) << 7);
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) =
         uVar2 & 0x7d7e | uVar12 | uVar7 | uVar8;
    uVar14 = (ushort)env->CP0_EntryLo0 >> 2 & 0xe;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) =
         uVar2 & 0x7d70 | uVar12 | uVar7 | uVar8 | uVar14;
    uVar5 = (ushort)(env->CP0_EntryLo0 >> 0x33) & 0x800;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) =
         uVar2 & 0x7570 | uVar12 | uVar7 | uVar8 | uVar14 | uVar5;
    uVar6 = (ushort)(env->CP0_EntryLo0 >> 0x32) & 0x2000;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) =
         uVar2 & 0x5570 | uVar12 | uVar7 | uVar8 | uVar14 | uVar5 | uVar6;
    uVar13 = (ulong)~(iVar3 >> 0xd);
    *(uint64_t *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x18) =
         (env->CP0_EntryLo0 >> 6 & uVar13) << 0xc;
    uVar9 = (ushort)(((uint)env->CP0_EntryLo1 & 2) << 7);
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) =
         uVar2 & 0x5470 | uVar12 | uVar7 | uVar8 | uVar14 | uVar5 | uVar6 | uVar9;
    uVar10 = (ushort)(((uint)env->CP0_EntryLo1 & 4) << 8);
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) =
         uVar2 & 0x5070 | uVar12 | uVar7 | uVar8 | uVar14 | uVar5 | uVar6 | uVar9 | uVar10;
    uVar12 = (uVar2 & 0x5000 | uVar12 | uVar7 | uVar8 | uVar14 | uVar5 | uVar6 | uVar9 | uVar10) +
             ((ushort)(int)env->CP0_EntryLo1 & 0x38) * 2;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) = uVar12;
    uVar2 = (ushort)(env->CP0_EntryLo1 >> 0x32) & 0x1000;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) = uVar12 & 0x6fff | uVar2;
    *(ushort *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x14) =
         uVar12 & 0x2fff | uVar2 | (ushort)(env->CP0_EntryLo1 >> 0x31) & 0x4000;
    *(uint64_t *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x20) =
         (env->CP0_EntryLo1 >> 6 & uVar13) << 0xc;
    return;
  }
  pbVar1 = (byte *)((long)&pCVar4->mmu + (long)idx * 0x28 + 0x15);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

static void r4k_fill_tlb(CPUMIPSState *env, int idx)
{
    r4k_tlb_t *tlb;
    uint64_t mask = env->CP0_PageMask >> (TARGET_PAGE_BITS + 1);

    /* XXX: detect conflicting TLBs and raise a MCHECK exception when needed */
    tlb = &env->tlb->mmu.r4k.tlb[idx];
    if (env->CP0_EntryHi & (1 << CP0EnHi_EHINV)) {
        tlb->EHINV = 1;
        return;
    }
    tlb->EHINV = 0;
    tlb->VPN = env->CP0_EntryHi & (TARGET_PAGE_MASK << 1);
#if defined(TARGET_MIPS64)
    tlb->VPN &= env->SEGMask;
#endif
    tlb->ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    tlb->MMID = env->CP0_MemoryMapID;
    tlb->PageMask = env->CP0_PageMask;
    tlb->G = env->CP0_EntryLo0 & env->CP0_EntryLo1 & 1;
    tlb->V0 = (env->CP0_EntryLo0 & 2) != 0;
    tlb->D0 = (env->CP0_EntryLo0 & 4) != 0;
    tlb->C0 = (env->CP0_EntryLo0 >> 3) & 0x7;
    tlb->XI0 = (env->CP0_EntryLo0 >> CP0EnLo_XI) & 1;
    tlb->RI0 = (env->CP0_EntryLo0 >> CP0EnLo_RI) & 1;
    tlb->PFN[0] = (get_tlb_pfn_from_entrylo(env->CP0_EntryLo0) & ~mask) << 12;
    tlb->V1 = (env->CP0_EntryLo1 & 2) != 0;
    tlb->D1 = (env->CP0_EntryLo1 & 4) != 0;
    tlb->C1 = (env->CP0_EntryLo1 >> 3) & 0x7;
    tlb->XI1 = (env->CP0_EntryLo1 >> CP0EnLo_XI) & 1;
    tlb->RI1 = (env->CP0_EntryLo1 >> CP0EnLo_RI) & 1;
    tlb->PFN[1] = (get_tlb_pfn_from_entrylo(env->CP0_EntryLo1) & ~mask) << 12;
}